

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_1ee5cf::RandomReadingTask::execute(RandomReadingTask *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  pthread_mutex_t *__mutex;
  long lVar9;
  TiledInputPart part;
  Box2i b1;
  Box2i b2;
  Array2D<half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  FrameBuffer frameBuffer;
  TiledInputPart local_100;
  int local_f4;
  int local_f0;
  int local_ec;
  TiledInputPart local_e8 [2];
  int local_d4;
  TiledInputPart local_d0;
  int local_c8;
  int local_c4;
  pthread_mutex_t *local_c0;
  Array2D<half> local_b8;
  Array2D<float> local_98;
  Array2D<unsigned_int> local_78;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  local_60;
  
  iVar3 = random_int((int)((ulong)(DAT_0043ecc0 - (anonymous_namespace)::headers) >> 3) *
                     -0x49249249);
  lVar9 = (long)iVar3;
  local_f0 = *(int *)((anonymous_namespace)::pixelTypes + lVar9 * 4);
  iVar6 = *(int *)((anonymous_namespace)::levelModes + lVar9 * 4);
  local_78._data = (uint *)0x0;
  local_78._sizeX = 0;
  local_78._sizeY = 0;
  local_98._data = (float *)0x0;
  local_98._sizeX = 0;
  local_98._sizeY = 0;
  local_b8._data = (half *)0x0;
  local_b8._sizeX = 0;
  local_b8._sizeY = 0;
  if (*(int *)((anonymous_namespace)::partTypes + lVar9 * 4) == 0) {
    iVar5 = random_int(0x107);
    iVar4 = random_int(0x107);
    iVar6 = iVar4;
    if (iVar4 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar5 < iVar4) {
      iVar4 = iVar5;
    }
    Imf_2_5::InputPart::InputPart((InputPart *)local_e8,this->file,iVar3);
    __mutex = (pthread_mutex_t *)((anonymous_namespace)::mutexes + lVar9 * 0x28);
    iVar3 = pthread_mutex_lock(__mutex);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    setInputFrameBuffer((FrameBuffer *)&local_60,local_f0,&local_78,&local_98,&local_b8,0xc5,0x107);
    Imf_2_5::InputPart::setFrameBuffer((InputPart *)local_e8,(FrameBuffer *)&local_60);
    Imf_2_5::InputPart::readPixels((InputPart *)local_e8,iVar4,iVar6);
    if (local_f0 == 0) {
      bVar2 = checkPixels<unsigned_int>(&local_78,0,0xc4,iVar4,iVar6,0xc5);
      if (!bVar2) {
        __assert_fail("checkPixels<unsigned int>(uData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x12a,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if (local_f0 == 1) {
      bVar2 = checkPixels<float>(&local_98,0,0xc4,iVar4,iVar6,0xc5);
      if (!bVar2) {
        __assert_fail("checkPixels<float>(fData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x12d,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if (local_f0 == 2) {
      bVar2 = checkPixels<half>(&local_b8,0,0xc4,iVar4,iVar6,0xc5);
      if (!bVar2) {
        __assert_fail("checkPixels<half>(hData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x130,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree(&local_60);
  }
  else {
    Imf_2_5::TiledInputPart::TiledInputPart(&local_100,this->file,iVar3);
    local_c0 = (pthread_mutex_t *)((anonymous_namespace)::mutexes + lVar9 * 0x28);
    iVar3 = pthread_mutex_lock(local_c0);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    iVar3 = Imf_2_5::TiledInputPart::numXLevels(&local_100);
    iVar4 = Imf_2_5::TiledInputPart::numYLevels(&local_100);
    iVar5 = random_int(iVar3);
    iVar3 = random_int(iVar4);
    if (iVar6 == 1) {
      iVar3 = iVar5;
    }
    local_f4 = Imf_2_5::TiledInputPart::levelWidth(&local_100,iVar5);
    iVar6 = Imf_2_5::TiledInputPart::levelHeight(&local_100,iVar3);
    iVar4 = Imf_2_5::TiledInputPart::numXTiles(&local_100,iVar5);
    local_ec = iVar5;
    local_d4 = iVar6;
    iVar6 = Imf_2_5::TiledInputPart::numYTiles(&local_100,iVar3);
    iVar7 = random_int(iVar4);
    iVar4 = random_int(iVar4);
    iVar8 = random_int(iVar6);
    iVar5 = random_int(iVar6);
    iVar1 = local_f0;
    iVar6 = iVar4;
    if (iVar7 < iVar4) {
      iVar6 = iVar7;
    }
    if (iVar4 < iVar7) {
      iVar4 = iVar7;
    }
    iVar7 = iVar5;
    if (iVar8 < iVar5) {
      iVar7 = iVar8;
    }
    if (iVar5 < iVar8) {
      iVar5 = iVar8;
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    setInputFrameBuffer((FrameBuffer *)&local_60,local_f0,&local_78,&local_98,&local_b8,local_f4,
                        local_d4);
    Imf_2_5::TiledInputPart::setFrameBuffer(&local_100,(FrameBuffer *)&local_60);
    Imf_2_5::TiledInputPart::readTiles(&local_100,iVar6,iVar4,iVar7,iVar5,local_ec,iVar3);
    iVar3 = local_ec;
    Imf_2_5::TiledInputPart::dataWindowForTile(local_e8,(int)&local_100,iVar6,iVar7,local_ec);
    Imf_2_5::TiledInputPart::dataWindowForTile(&local_d0,(int)&local_100,iVar4,iVar5,iVar3);
    if (iVar1 == 0) {
      bVar2 = checkPixels<unsigned_int>
                        (&local_78,(int)local_e8[0].file,local_c8,local_e8[0].file._4_4_,local_c4,
                         local_f4);
      if (!bVar2) {
        __assert_fail("checkPixels<unsigned int>(uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x161,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if (iVar1 == 1) {
      bVar2 = checkPixels<float>(&local_98,(int)local_e8[0].file,local_c8,local_e8[0].file._4_4_,
                                 local_c4,local_f4);
      if (!bVar2) {
        __assert_fail("checkPixels<float>(fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x165,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if (iVar1 == 2) {
      bVar2 = checkPixels<half>(&local_b8,(int)local_e8[0].file,local_c8,local_e8[0].file._4_4_,
                                local_c4,local_f4);
      if (!bVar2) {
        __assert_fail("checkPixels<half>(hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x169,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree(&local_60);
    __mutex = local_c0;
  }
  pthread_mutex_unlock(__mutex);
  if (local_b8._data != (half *)0x0) {
    operator_delete__(local_b8._data);
  }
  if (local_98._data != (float *)0x0) {
    operator_delete__(local_98._data);
  }
  if (local_78._data != (uint *)0x0) {
    operator_delete__(local_78._data);
  }
  return;
}

Assistant:

void execute()
        {
            int partNumber = random_int(headers.size());
            int partType = partTypes[partNumber];
            int pixelType = pixelTypes[partNumber];
            int levelMode = levelModes[partNumber];

            Array2D<unsigned int> uData;
            Array2D<float> fData;
            Array2D<half> hData;
            if (partType == 0)
            {
                int l1, l2;
                l1 = random_int(height);
                l2 = random_int(height);
                if (l1 > l2) swap(l1, l2);

                InputPart part(*file, partNumber);
                //
                // We add lock here to assure that two threads that accessing
                // the same part won't mess things up.
                //
                Lock lock(mutexes[partNumber]);

                FrameBuffer frameBuffer;
                setInputFrameBuffer(frameBuffer, pixelType,
                                    uData, fData, hData, width, height);

                part.setFrameBuffer(frameBuffer);
                part.readPixels(l1, l2);

                switch (pixelType)
                {
                    case 0:
                        assert(checkPixels<unsigned int>(uData, 0, width - 1, l1, l2, width));
                        break;
                    case 1:
                        assert(checkPixels<float>(fData, 0, width - 1, l1, l2, width));
                        break;
                    case 2:
                        assert(checkPixels<half>(hData, 0, width - 1, l1, l2, width));
                        break;
                }
            }
            else
            {
                int tx1, tx2, ty1, ty2;
                int lx, ly;

                TiledInputPart part(*file, partNumber);
                //
                // We add lock here to assure that two threads that accessing
                // the same part won't mess things up.
                //
                Lock lock(mutexes[partNumber]);

                int numXLevels = part.numXLevels();
                int numYLevels = part.numYLevels();

                lx = random_int(numXLevels);
                ly = random_int(numYLevels);
                if (levelMode == 1) ly = lx;

                int w = part.levelWidth(lx);
                int h = part.levelHeight(ly);

                int numXTiles = part.numXTiles(lx);
                int numYTiles = part.numYTiles(ly);
                tx1 = random_int(numXTiles);
                tx2 = random_int(numXTiles);
                ty1 = random_int(numYTiles);
                ty2 = random_int(numYTiles);
                if (tx1 > tx2) swap(tx1, tx2);
                if (ty1 > ty2) swap(ty1, ty2);

                FrameBuffer frameBuffer;
                setInputFrameBuffer(frameBuffer, pixelType,
                                    uData, fData, hData, w, h);

                part.setFrameBuffer(frameBuffer);
                part.readTiles(tx1, tx2, ty1, ty2, lx, ly);

                Box2i b1 = part.dataWindowForTile(tx1, ty1, lx, ly);
                Box2i b2 = part.dataWindowForTile(tx2, ty2, lx, ly);

                switch (pixelType)
                {
                    case 0:
                        assert(checkPixels<unsigned int>(uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                                                         w));
                        break;
                    case 1:
                        assert(checkPixels<float>(fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                                                  w));
                        break;
                    case 2:
                        assert(checkPixels<half>(hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                                                 w));
                        break;
                }
            }
        }